

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

ull bf_(int s,int l,ull *a,ull *m)

{
  byte bVar1;
  ulong uVar2;
  ull uVar3;
  long lVar4;
  ulong uVar5;
  
  bVar1 = (byte)((long)s % 0x40);
  uVar5 = ~(-1L << ((byte)l & 0x3f));
  uVar2 = uVar5 << (bVar1 & 0x3f);
  lVar4 = (long)(s / 0x40);
  m[lVar4] = m[lVar4] | uVar2;
  uVar3 = (uVar2 & a[lVar4]) >> (bVar1 & 0x3f);
  if (0x40 < l + (int)((long)s % 0x40)) {
    uVar5 = uVar5 >> (-bVar1 & 0x3f);
    m[lVar4 + 1] = m[lVar4 + 1] | uVar5;
    uVar3 = uVar3 | (uVar5 & a[lVar4 + 1]) << (-bVar1 & 0x3f);
  }
  return uVar3;
}

Assistant:

static inline ull bf_(int s, int l, ull *a, ull *m) {
	int idx = s / 0x40;
	int bit = s % 0x40;
	ull res = 0;
	ull m0 = (((1ull << l) - 1) << bit);
	m[idx] |= m0;
	res |= (a[idx] & m0) >> bit;
	if (bit + l > 0x40) {
		ull m1 = (((1ull << l) - 1) >> (0x40 - bit));
		m[idx+1] |= m1;
		res |= (a[idx+1] & m1) << (0x40 - bit);
	}
	return res;
}